

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausPrintIndClauses(Clu_Man_t *p)

{
  int iVar1;
  int i;
  int iVar2;
  ulong uVar3;
  int Counters [9];
  
  Counters[8] = 0;
  Counters[4] = 0;
  Counters[5] = 0;
  Counters[6] = 0;
  Counters[7] = 0;
  Counters[0] = 0;
  Counters[1] = 0;
  Counters[2] = 0;
  Counters[3] = 0;
  i = 0;
  iVar2 = 0;
  while( true ) {
    if (p->vClausesProven->nSize <= i) break;
    iVar1 = Vec_IntEntry(p->vClausesProven,i);
    if (iVar1 - iVar2 < 8) {
      Counters[iVar1 - iVar2] = Counters[iVar1 - iVar2] + 1;
    }
    else {
      Counters[8] = Counters[8] + 1;
    }
    i = i + 1;
    iVar2 = iVar1;
  }
  printf("SUMMARY: Total proved clauses = %d. ");
  printf("Clause per lit: ");
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    if (Counters[uVar3] != 0) {
      printf("%d=%d ",uVar3 & 0xffffffff);
    }
  }
  if (Counters[8] != 0) {
    printf(">7=%d ");
  }
  putchar(10);
  return;
}

Assistant:

void Fra_ClausPrintIndClauses( Clu_Man_t * p )
{
    int Counters[9] = {0};
    int * pStart; 
    int Beg, End, i;
    Beg = 0;
    pStart = Vec_IntArray( p->vLitsProven );
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        if ( End - Beg >= 8 )
            Counters[8]++;
        else
            Counters[End - Beg]++;
//printf( "%d ", End-Beg );
        Beg = End;
    }
    printf( "SUMMARY: Total proved clauses = %d. ", Vec_IntSize(p->vClausesProven) );
    printf( "Clause per lit: " );
    for ( i = 0; i < 8; i++ )
        if ( Counters[i] )
            printf( "%d=%d ", i, Counters[i] );
    if ( Counters[8] )
            printf( ">7=%d ", Counters[8] );
    printf( "\n" );
}